

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::
~DoublePtrHelper(DoublePtrHelper<Diligent::IFileStream> *this)

{
  RefCntAutoPtr<Diligent::IFileStream> *pRVar1;
  IFileStream *pIVar2;
  IFileStream *pIVar3;
  
  pRVar1 = this->m_pAutoPtr;
  if (pRVar1 != (RefCntAutoPtr<Diligent::IFileStream> *)0x0) {
    pIVar2 = pRVar1->m_pObject;
    pIVar3 = this->NewRawPtr;
    if (pIVar2 != pIVar3) {
      if (pIVar2 != (IFileStream *)0x0) {
        (*(pIVar2->super_IObject)._vptr_IObject[2])();
      }
      pRVar1->m_pObject = pIVar3;
    }
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }